

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  cmGlobalGenerator *this_01;
  cmake *this_02;
  cmMakefile *this_03;
  reference ppcVar6;
  reference pbVar7;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar8;
  bool local_525;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_480;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  const_iterator ci;
  undefined1 local_460 [6];
  bool newCMP0022Behavior;
  allocator local_439;
  string local_438;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  undefined1 local_350 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gte;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_310;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_308;
  const_iterator tei_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  cmListFileBacktrace local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  ostringstream e;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  cmGeneratorTarget *local_a8;
  cmGeneratorTarget *te;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  const_iterator tei;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  string sep;
  string expectedTargets;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  GetTargets(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_90,&local_98);
  do {
    te = (cmGeneratorTarget *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
    bVar1 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&te);
    if (!bVar1) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
                (this,os,(undefined1 *)((long)&sep.field_2 + 8));
      bVar1 = false;
LAB_006afed6:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::__cxx11::string::~string
                ((string *)
                 &targets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tei_1);
        local_310._M_current =
             (cmGeneratorTarget **)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                       (&this->Exports);
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
        ::__normal_iterator<cmGeneratorTarget**>
                  ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                    *)&local_308,&local_310);
        while( true ) {
          gte = (cmGeneratorTarget *)
                std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                          (&this->Exports);
          bVar1 = __gnu_cxx::operator!=
                            (&local_308,
                             (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                              *)&gte);
          if (!bVar1) break;
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_308);
          properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar6;
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                    (this,os,properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          cmTarget::AppendBuildInterfaceIncludes
                    (*(cmTarget **)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_350);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_370,"INTERFACE_INCLUDE_DIRECTORIES",&local_371);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_370,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_398,"INTERFACE_SOURCES",&local_399);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_398,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3c0,"INTERFACE_COMPILE_DEFINITIONS",&local_3c1);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_3c0,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3e8,"INTERFACE_COMPILE_OPTIONS",&local_3e9);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_3e8,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_410,"INTERFACE_AUTOUIC_OPTIONS",&local_411);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_410,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_438,"INTERFACE_COMPILE_FEATURES",&local_439)
          ;
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_438,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator((allocator<char> *)&local_439);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_460,"INTERFACE_POSITION_INDEPENDENT_CODE",
                     (allocator *)((long)&ci._M_current + 7));
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,(string *)local_460,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_350);
          std::__cxx11::string::~string((string *)local_460);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ci._M_current + 7));
          PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_525 = false;
          if (PVar3 != WARN) {
            PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_525 = PVar3 != OLD;
          }
          ci._M_current._6_1_ = local_525;
          if (local_525 != false) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,
                       (cmGeneratorTarget *)
                       properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                       (ImportPropertyMap *)local_350,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&tei_1);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_350);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,local_350);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_350);
          __gnu_cxx::
          __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
          ::operator++(&local_308);
        }
        local_478._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&(this->super_cmExportFileGenerator).Configurations);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_470,&local_478);
        while( true ) {
          local_480._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&(this->super_cmExportFileGenerator).Configurations);
          bVar1 = __gnu_cxx::operator!=(&local_470,&local_480);
          if (!bVar1) break;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_470);
          cmExportFileGenerator::GenerateImportConfig
                    (&this->super_cmExportFileGenerator,os,pbVar7,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tei_1);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_470);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os,&tei_1);
        this_local._7_1_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tei_1);
      }
      return (bool)(this_local._7_1_ & 1);
    }
    this_00 = this->LG;
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_90);
    local_a8 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,pbVar7);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_108,local_a8);
    std::operator+(&local_c8,&local_e8,&local_108);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::operator=
              ((string *)
               &targets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
    pVar8 = std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_a8);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      poVar4 = std::operator<<((ostream *)local_2a0,"given target \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(local_a8);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\" more than once.");
      this_01 = cmLocalGenerator::GetGlobalGenerator(this->LG);
      this_02 = cmGlobalGenerator::GetCMakeInstance(this_01);
      std::__cxx11::ostringstream::str();
      this_03 = cmLocalGenerator::GetMakefile(this->LG);
      cmMakefile::GetBacktrace(&local_2e0,this_03);
      cmake::IssueMessage(this_02,FATAL_ERROR,&local_2c0,&local_2e0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_2e0);
      std::__cxx11::string::~string((string *)&local_2c0);
      this_local._7_1_ = 0;
      bVar1 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      goto LAB_006afed6;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
              (&this->Exports,&local_a8);
    TVar2 = cmGeneratorTarget::GetType(local_a8);
    if (TVar2 == INTERFACE_LIBRARY) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.0.0");
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    this->GetTargets(targets);
    for (std::vector<std::string>::const_iterator tei = targets.begin();
         tei != targets.end(); ++tei) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(*tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          cmake::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      if (te->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        this->GenerateRequiredCMakeVersion(os, "3.0.0");
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (std::vector<cmGeneratorTarget*>::const_iterator tei =
         this->Exports.begin();
       tei != this->Exports.end(); ++tei) {
    cmGeneratorTarget* gte = *tei;
    this->GenerateImportTargetCode(os, gte);

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);
    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::vector<std::string>::const_iterator ci =
         this->Configurations.begin();
       ci != this->Configurations.end(); ++ci) {
    this->GenerateImportConfig(os, *ci, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}